

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O0

conv_object conv_init(int N,int L)

{
  int iVar1;
  conv_object pcVar2;
  fft_real_object pfVar3;
  int conv_len;
  conv_object obj;
  int L_local;
  int N_local;
  
  pcVar2 = (conv_object)malloc(0x20);
  iVar1 = findnexte(N + L + -1);
  pcVar2->clen = iVar1;
  pcVar2->ilen1 = N;
  pcVar2->ilen2 = L;
  pfVar3 = fft_real_init(pcVar2->clen,1);
  pcVar2->fobj = pfVar3;
  pfVar3 = fft_real_init(pcVar2->clen,-1);
  pcVar2->iobj = pfVar3;
  return pcVar2;
}

Assistant:

conv_object conv_init(int N, int L) {
	
	conv_object obj = NULL;
	int conv_len;
	conv_len = N + L - 1;
		
	obj = (conv_object) malloc (sizeof(struct conv_set));
	 
	//obj->clen = npow2(conv_len);
	//obj->clen = conv_len;
	obj->clen = findnexte(conv_len);
	obj->ilen1 = N;
	obj->ilen2 = L;
	
	obj->fobj = fft_real_init(obj->clen,1);
	obj->iobj = fft_real_init(obj->clen,-1);
	
	return obj;
	
}